

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFMatrix<long>::TPZFMatrix
          (TPZFMatrix<long> *this,initializer_list<std::initializer_list<long>_> *list)

{
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01669328;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fWork).fStore = (long *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  Initialize(this,list);
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const std::initializer_list<std::initializer_list<TVar>> &list)
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId)
{
    this->Initialize(list);
}